

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O2

void llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::format
               (iterator_range<llvm::StringRef_*> *V,raw_ostream *Stream,StringRef Style)

{
  StringRef *pSVar1;
  StringRef Str;
  size_t in_R8;
  StringRef *this;
  StringRef Style_00;
  pair<llvm::StringRef,_llvm::StringRef> local_60;
  char *local_40;
  size_t local_38;
  
  parseOptions(&local_60,Style);
  local_40 = local_60.first.Data;
  local_38 = local_60.first.Length;
  this = V->begin_iterator;
  pSVar1 = V->end_iterator;
  if (this == pSVar1) goto LAB_00b553f5;
  while( true ) {
    Style_00.Length = in_R8;
    Style_00.Data = (char *)local_60.second.Length;
    format_provider<llvm::StringRef,_void>::format
              ((format_provider<llvm::StringRef,_void> *)this,(StringRef *)Stream,
               (raw_ostream *)local_60.second.Data,Style_00);
    this = this + 1;
LAB_00b553f5:
    if (this == pSVar1) break;
    Str.Length = local_38;
    Str.Data = local_40;
    raw_ostream::operator<<(Stream,Str);
  }
  return;
}

Assistant:

static void format(const llvm::iterator_range<IterT> &V,
                     llvm::raw_ostream &Stream, StringRef Style) {
    StringRef Sep;
    StringRef ArgStyle;
    std::tie(Sep, ArgStyle) = parseOptions(Style);
    auto Begin = V.begin();
    auto End = V.end();
    if (Begin != End) {
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
    while (Begin != End) {
      Stream << Sep;
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
  }